

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O1

void __thiscall
Kernel::BooleanSubtermIt::BooleanSubtermIt(BooleanSubtermIt *this,Term *term,bool includeSelf)

{
  Stack<Kernel::Term_*> *this_00;
  Term ***pppTVar1;
  size_t sVar2;
  Term *pTVar3;
  Term **ppTVar4;
  ulong uVar5;
  Term *pTVar6;
  
  (this->super_IteratorCore<Kernel::TermList>)._refCnt = 0;
  (this->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore =
       (_func_int **)&PTR__BooleanSubtermIt_00b69a20;
  (this->super_IteratorCore<Kernel::TermList>).field_0xc = 1;
  (this->_next)._content = 2;
  (this->_stack)._capacity = 8;
  ppTVar4 = (Term **)::Lib::FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)
                                (::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  this_00 = &this->_stack;
  (this->_stack)._stack = ppTVar4;
  (this->_stack)._cursor = ppTVar4;
  sVar2 = (this->_stack)._capacity;
  (this->_stack)._end = ppTVar4 + sVar2;
  if ((term->_args[0]._content & 0x10) == 0) {
    pTVar6 = term;
    if (sVar2 == 0) {
      ::Lib::Stack<Kernel::Term_*>::expand(this_00);
    }
  }
  else {
    uVar5 = (ulong)(*(uint *)&term->field_0xc & 0xfffffff);
    pTVar6 = (Term *)term->_args[uVar5 - 1]._content;
    pTVar3 = (Term *)term->_args[uVar5]._content;
    if (((ulong)pTVar3 & 1) == 0) {
      if (sVar2 == 0) {
        ::Lib::Stack<Kernel::Term_*>::expand(this_00);
      }
      *(this->_stack)._cursor = pTVar3;
      pppTVar1 = &(this->_stack)._cursor;
      *pppTVar1 = *pppTVar1 + 1;
    }
    if (((ulong)pTVar6 & 1) != 0) {
      return;
    }
    if ((this->_stack)._cursor == (this->_stack)._end) {
      ::Lib::Stack<Kernel::Term_*>::expand(this_00);
    }
  }
  *(this->_stack)._cursor = pTVar6;
  pppTVar1 = &(this->_stack)._cursor;
  *pppTVar1 = *pppTVar1 + 1;
  return;
}

Assistant:

BooleanSubtermIt(Term* term, bool includeSelf=false) 
  : _used(true), _stack(8)
  {
    if(term->isLiteral()){
      TermList t0 = *term->nthArgument(0);
      TermList t1 = *term->nthArgument(1);
      if(!t0.isVar()){ _stack.push(t0.term()); }
      if(!t1.isVar()){ _stack.push(t1.term()); }      
      return;      
    } 
    _stack.push(term);
  }